

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idec_dec.c
# Opt level: O0

void DoRemap(WebPIDecoder *idec,ptrdiff_t offset)

{
  uint uVar1;
  void *pvVar2;
  long lVar3;
  int iVar4;
  MemBuffer_conflict *mem_00;
  uint8_t *puVar5;
  size_t sVar6;
  long in_RSI;
  WebPIDecoder *in_RDI;
  VP8LDecoder *dec_1;
  VP8LDecoder *alph_vp8l_dec;
  ALPHDecoder *alph_dec;
  uint8_t *last_start;
  uint32_t p;
  uint32_t last_part;
  VP8Decoder *dec;
  uint8_t *new_base;
  MemBuffer_conflict *mem;
  size_t in_stack_ffffffffffffffa0;
  VP8LBitReader *len;
  uint8_t *in_stack_ffffffffffffffa8;
  VP8LBitReader *in_stack_ffffffffffffffb0;
  VP8LBitReader *br;
  uint local_30;
  
  mem_00 = &in_RDI->mem_;
  puVar5 = (in_RDI->mem_).buf_ + (in_RDI->mem_).start_;
  (in_RDI->io_).data = puVar5;
  sVar6 = MemDataSize(mem_00);
  (in_RDI->io_).data_size = sVar6;
  if (in_RDI->dec_ != (void *)0x0) {
    if (in_RDI->is_lossless_ == 0) {
      pvVar2 = in_RDI->dec_;
      uVar1 = *(uint *)((long)pvVar2 + 0x1b0);
      if (in_RSI != 0) {
        for (local_30 = 0; local_30 <= uVar1; local_30 = local_30 + 1) {
          VP8RemapBitReader((VP8BitReader *)((long)pvVar2 + (ulong)local_30 * 0x30 + 0x1b8),in_RSI);
        }
        if (mem_00->mode_ == MEM_MODE_MAP) {
          VP8RemapBitReader((VP8BitReader *)((long)pvVar2 + 0x10),in_RSI);
        }
      }
      puVar5 = *(uint8_t **)((long)pvVar2 + (ulong)uVar1 * 0x30 + 0x1c8);
      VP8BitReaderSetBuffer
                ((VP8BitReader *)((long)pvVar2 + (ulong)uVar1 * 0x30 + 0x1b8),puVar5,
                 (size_t)((in_RDI->mem_).buf_ + ((in_RDI->mem_).end_ - (long)puVar5)));
      iVar4 = NeedCompressedAlpha(in_RDI);
      if (iVar4 != 0) {
        lVar3 = *(long *)((long)pvVar2 + 0xb90);
        *(long *)((long)pvVar2 + 0xb98) = in_RSI + *(long *)((long)pvVar2 + 0xb98);
        if (((lVar3 != 0) && (*(long *)(lVar3 + 0x18) != 0)) && (*(int *)(lVar3 + 8) == 1)) {
          VP8LBitReaderSetBuffer
                    (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
        }
      }
    }
    else {
      br = (VP8LBitReader *)in_RDI->dec_;
      len = br + 1;
      MemDataSize(mem_00);
      VP8LBitReaderSetBuffer(br,puVar5,(size_t)len);
    }
  }
  return;
}

Assistant:

static void DoRemap(WebPIDecoder* const idec, ptrdiff_t offset) {
  MemBuffer* const mem = &idec->mem_;
  const uint8_t* const new_base = mem->buf_ + mem->start_;
  // note: for VP8, setting up idec->io_ is only really needed at the beginning
  // of the decoding, till partition #0 is complete.
  idec->io_.data = new_base;
  idec->io_.data_size = MemDataSize(mem);

  if (idec->dec_ != NULL) {
    if (!idec->is_lossless_) {
      VP8Decoder* const dec = (VP8Decoder*)idec->dec_;
      const uint32_t last_part = dec->num_parts_minus_one_;
      if (offset != 0) {
        uint32_t p;
        for (p = 0; p <= last_part; ++p) {
          VP8RemapBitReader(dec->parts_ + p, offset);
        }
        // Remap partition #0 data pointer to new offset, but only in MAP
        // mode (in APPEND mode, partition #0 is copied into a fixed memory).
        if (mem->mode_ == MEM_MODE_MAP) {
          VP8RemapBitReader(&dec->br_, offset);
        }
      }
      {
        const uint8_t* const last_start = dec->parts_[last_part].buf_;
        VP8BitReaderSetBuffer(&dec->parts_[last_part], last_start,
                              mem->buf_ + mem->end_ - last_start);
      }
      if (NeedCompressedAlpha(idec)) {
        ALPHDecoder* const alph_dec = dec->alph_dec_;
        dec->alpha_data_ += offset;
        if (alph_dec != NULL && alph_dec->vp8l_dec_ != NULL) {
          if (alph_dec->method_ == ALPHA_LOSSLESS_COMPRESSION) {
            VP8LDecoder* const alph_vp8l_dec = alph_dec->vp8l_dec_;
            assert(dec->alpha_data_size_ >= ALPHA_HEADER_LEN);
            VP8LBitReaderSetBuffer(&alph_vp8l_dec->br_,
                                   dec->alpha_data_ + ALPHA_HEADER_LEN,
                                   dec->alpha_data_size_ - ALPHA_HEADER_LEN);
          } else {  // alph_dec->method_ == ALPHA_NO_COMPRESSION
            // Nothing special to do in this case.
          }
        }
      }
    } else {    // Resize lossless bitreader
      VP8LDecoder* const dec = (VP8LDecoder*)idec->dec_;
      VP8LBitReaderSetBuffer(&dec->br_, new_base, MemDataSize(mem));
    }
  }
}